

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O0

void OutputCircularDependencies
               (Configuration *config,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
               *components,path *outfile)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  Configuration *config_00;
  Component *a;
  undefined8 in_RSI;
  Component **t;
  iterator __end2;
  iterator __begin2;
  unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
  *__range2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>
  *c;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
  *__range1;
  ostream *out;
  OstreamHolder outHolder;
  Component *in_stack_fffffffffffffc98;
  _Node_iterator<Component_*,_true,_false> *in_stack_fffffffffffffca0;
  Component *in_stack_fffffffffffffcb8;
  OstreamHolder *in_stack_fffffffffffffcc0;
  string local_2d8 [32];
  string local_2b8 [16];
  Component *in_stack_fffffffffffffd58;
  _Node_iterator_base<Component_*,_false> local_290;
  _Node_iterator_base<Component_*,_false> local_288;
  unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
  *local_280;
  string local_278 [32];
  reference local_258;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_true>
  local_250;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_true>
  local_248;
  undefined8 local_240;
  ostream *local_228;
  OstreamHolder local_220;
  undefined8 local_10;
  
  local_10 = in_RSI;
  OstreamHolder::OstreamHolder(in_stack_fffffffffffffcc0,&in_stack_fffffffffffffcb8->root);
  local_228 = OstreamHolder::get(&local_220);
  poVar2 = std::operator<<(local_228,"digraph dependencies {");
  std::operator<<(poVar2,'\n');
  local_240 = local_10;
  local_248._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
       ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
                *)in_stack_fffffffffffffc98);
  local_250._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
              *)in_stack_fffffffffffffc98);
  while (bVar1 = std::__detail::operator!=(&local_248,&local_250), bVar1) {
    local_258 = std::__detail::
                _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_false,_true>
                ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_false,_true>
                             *)0x1a3424);
    bVar1 = std::
            unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
            ::empty((unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
                     *)0x1a3444);
    if (!bVar1) {
      poVar2 = std::operator<<(local_228,"  ");
      Component::QuotedName_abi_cxx11_(in_stack_fffffffffffffd58);
      poVar2 = std::operator<<(poVar2,local_278);
      poVar2 = std::operator<<(poVar2," [shape=");
      pcVar3 = getShapeForSize(in_stack_fffffffffffffc98);
      poVar2 = std::operator<<(poVar2,pcVar3);
      std::operator<<(poVar2,"];\n");
      std::__cxx11::string::~string(local_278);
      local_280 = &local_258->second->circulars;
      local_288._M_cur =
           (__node_type *)
           std::
           unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
           ::begin((unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
                    *)in_stack_fffffffffffffc98);
      local_290._M_cur =
           (__node_type *)
           std::
           unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
           ::end((unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
                  *)in_stack_fffffffffffffc98);
      while (bVar1 = std::__detail::operator!=(&local_288,&local_290), bVar1) {
        std::__detail::_Node_iterator<Component_*,_true,_false>::operator*
                  ((_Node_iterator<Component_*,_true,_false> *)0x1a358c);
        poVar2 = std::operator<<(local_228,"  ");
        Component::QuotedName_abi_cxx11_(in_stack_fffffffffffffd58);
        poVar2 = std::operator<<(poVar2,local_2b8);
        poVar2 = std::operator<<(poVar2," -> ");
        Component::QuotedName_abi_cxx11_(in_stack_fffffffffffffd58);
        config_00 = (Configuration *)std::operator<<(poVar2,local_2d8);
        a = (Component *)std::operator<<((ostream *)config_00," [color=");
        in_stack_fffffffffffffcb8 =
             (Component *)getLinkColor_abi_cxx11_(config_00,a,in_stack_fffffffffffffcb8);
        poVar2 = std::operator<<((ostream *)a,(string *)in_stack_fffffffffffffcb8);
        poVar2 = std::operator<<(poVar2,"];");
        std::operator<<(poVar2,'\n');
        std::__cxx11::string::~string(local_2d8);
        std::__cxx11::string::~string(local_2b8);
        std::__detail::_Node_iterator<Component_*,_true,_false>::operator++
                  (in_stack_fffffffffffffca0);
      }
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_false,_true>
                  *)in_stack_fffffffffffffca0);
  }
  poVar2 = std::operator<<(local_228,"}");
  std::operator<<(poVar2,'\n');
  OstreamHolder::~OstreamHolder((OstreamHolder *)0x1a3795);
  return;
}

Assistant:

void OutputCircularDependencies(const Configuration& config, std::unordered_map<std::string, Component *> &components,
                                const filesystem::path &outfile) {
    OstreamHolder outHolder(outfile);
    std::ostream& out = outHolder.get();
    out << "digraph dependencies {" << '\n';
    for (const auto &c : components) {
        if (c.second->circulars.empty()) {
            continue;
        }

        out << "  " << c.second->QuotedName() << " [shape=" << getShapeForSize(c.second) << "];\n";

        for (const auto &t : c.second->circulars) {
            out << "  " << c.second->QuotedName() << " -> " << t->QuotedName() << " [color="
                << getLinkColor(config, c.second, t) << "];" << '\n';
        }
    }
    out << "}" << '\n';
}